

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int session_set_outgoing_window(SESSION_HANDLE session,uint32_t outgoing_window)

{
  if (session != (SESSION_HANDLE)0x0) {
    session->outgoing_window = outgoing_window;
    return 0;
  }
  return 0x3fc;
}

Assistant:

int session_set_outgoing_window(SESSION_HANDLE session, uint32_t outgoing_window)
{
    int result;

    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        session_instance->outgoing_window = outgoing_window;

        result = 0;
    }

    return result;
}